

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.hpp
# Opt level: O0

void __thiscall OpenMD::Shape::~Shape(Shape *this)

{
  code *pcVar1;
  Shape *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Shape() = default;